

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::set
               (PointerBuilder builder,Reader *value)

{
  bool bVar1;
  Fault local_78;
  Fault f;
  Reader local_40;
  Reader *local_10;
  Reader *value_local;
  
  local_10 = value;
  Schema::getProto((Reader *)&f,(Schema *)value);
  capnp::schema::Node::Reader::getStruct(&local_40,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x768,FAILED,"!value.schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  PointerBuilder::setStruct(&builder,&local_10->reader,false);
  return;
}

Assistant:

void PointerHelpers<DynamicStruct, Kind::OTHER>::set(
    PointerBuilder builder, const DynamicStruct::Reader& value) {
  KJ_REQUIRE(!value.schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  builder.setStruct(value.reader);
}